

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_set_rd_speed_thresholds(AV1_COMP *cpi)

{
  long in_RDI;
  RD_OPT *rd;
  
  memset((undefined4 *)(in_RDI + 0x42f38),0,0x2a4);
  *(undefined4 *)(in_RDI + 0x42f38) = 300;
  *(undefined4 *)(in_RDI + 0x42f3c) = 300;
  *(undefined4 *)(in_RDI + 0x42f40) = 300;
  *(undefined4 *)(in_RDI + 0x42f44) = 300;
  *(undefined4 *)(in_RDI + 0x42f48) = 300;
  *(undefined4 *)(in_RDI + 0x42f4c) = 300;
  *(undefined4 *)(in_RDI + 0x42f50) = 300;
  *(undefined4 *)(in_RDI + 0x42f54) = 1000;
  *(undefined4 *)(in_RDI + 0x42f58) = 1000;
  *(undefined4 *)(in_RDI + 0x42f5c) = 1000;
  *(undefined4 *)(in_RDI + 0x42f60) = 1000;
  *(undefined4 *)(in_RDI + 0x42f64) = 0x44c;
  *(undefined4 *)(in_RDI + 0x42f68) = 1000;
  *(undefined4 *)(in_RDI + 0x42f6c) = 1000;
  *(undefined4 *)(in_RDI + 0x42f70) = 1000;
  *(undefined4 *)(in_RDI + 0x42f74) = 1000;
  *(undefined4 *)(in_RDI + 0x42f78) = 1000;
  *(undefined4 *)(in_RDI + 0x42f7c) = 1000;
  *(undefined4 *)(in_RDI + 0x42f80) = 1000;
  *(undefined4 *)(in_RDI + 0x42f84) = 1000;
  *(undefined4 *)(in_RDI + 0x42f88) = 1000;
  *(undefined4 *)(in_RDI + 0x42f8c) = 0x898;
  *(undefined4 *)(in_RDI + 0x42f90) = 2000;
  *(undefined4 *)(in_RDI + 0x42f94) = 2000;
  *(undefined4 *)(in_RDI + 0x42f98) = 0x960;
  *(undefined4 *)(in_RDI + 0x42f9c) = 2000;
  *(undefined4 *)(in_RDI + 0x42fa4) = 2000;
  *(undefined4 *)(in_RDI + 0x42fa0) = 0x960;
  *(undefined4 *)(in_RDI + 0x42fa8) = 0x44c;
  *(undefined4 *)(in_RDI + 0x42fac) = 1000;
  *(undefined4 *)(in_RDI + 0x42fb0) = 800;
  *(undefined4 *)(in_RDI + 0x42fb4) = 900;
  *(undefined4 *)(in_RDI + 0x42fb8) = 1000;
  *(undefined4 *)(in_RDI + 0x42fbc) = 1000;
  *(undefined4 *)(in_RDI + 0x42fc0) = 1000;
  *(undefined4 *)(in_RDI + 0x42fc4) = 1000;
  *(undefined4 *)(in_RDI + 0x42fc8) = 1000;
  *(undefined4 *)(in_RDI + 0x42fcc) = 1000;
  *(undefined4 *)(in_RDI + 0x42fd0) = 1000;
  *(undefined4 *)(in_RDI + 0x42fd4) = 1000;
  *(undefined4 *)(in_RDI + 0x42fd8) = 2000;
  *(undefined4 *)(in_RDI + 0x42fdc) = 2000;
  *(undefined4 *)(in_RDI + 0x42fe0) = 2000;
  *(undefined4 *)(in_RDI + 0x42fe4) = 2000;
  *(undefined4 *)(in_RDI + 0x43004) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x43010) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x4300c) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43018) = 0x5fa;
  *(undefined4 *)(in_RDI + 0x43014) = 0x74e;
  *(undefined4 *)(in_RDI + 0x43008) = 0x960;
  *(undefined4 *)(in_RDI + 0x4301c) = 0xabe;
  *(undefined4 *)(in_RDI + 0x43020) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x4302c) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43028) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43034) = 0x74e;
  *(undefined4 *)(in_RDI + 0x43030) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43024) = 0x708;
  *(undefined4 *)(in_RDI + 0x43038) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x4303c) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x43048) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43044) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43050) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x4304c) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43040) = 2000;
  *(undefined4 *)(in_RDI + 0x43054) = 3000;
  *(undefined4 *)(in_RDI + 0x43058) = 0x528;
  *(undefined4 *)(in_RDI + 0x43064) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43060) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x4306c) = 0x7f8;
  *(undefined4 *)(in_RDI + 0x43068) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x4305c) = 2000;
  *(undefined4 *)(in_RDI + 0x43070) = 0x8ca;
  *(undefined4 *)(in_RDI + 0x42fe8) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x42ff4) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x42ff0) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x42ffc) = 0x550;
  *(undefined4 *)(in_RDI + 0x42ff8) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x42fec) = 0x960;
  *(undefined4 *)(in_RDI + 0x43000) = 0x8ca;
  *(undefined4 *)(in_RDI + 0x43074) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x43080) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x4307c) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43088) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43084) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43078) = 2000;
  *(undefined4 *)(in_RDI + 0x4308c) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x43090) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x4309c) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43098) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x430a4) = 0x74e;
  *(undefined4 *)(in_RDI + 0x430a0) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43094) = 2000;
  *(undefined4 *)(in_RDI + 0x430a8) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x430ac) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x430b8) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x430b4) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x430c0) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x430bc) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x430b0) = 2000;
  *(undefined4 *)(in_RDI + 0x430c4) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x430c8) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x430d4) = 0x708;
  *(undefined4 *)(in_RDI + 0x430d0) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x430dc) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x430d8) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x430cc) = 2000;
  *(undefined4 *)(in_RDI + 0x430e0) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x430e4) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x430f0) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x430ec) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x430f8) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x430f4) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x430e8) = 2000;
  *(undefined4 *)(in_RDI + 0x430fc) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x43100) = 0x5a0;
  *(undefined4 *)(in_RDI + 0x4310c) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43108) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43114) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43110) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43104) = 2000;
  *(undefined4 *)(in_RDI + 0x43118) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x4311c) = 0x4b0;
  *(undefined4 *)(in_RDI + 0x43128) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43124) = 0x5dc;
  *(undefined4 *)(in_RDI + 0x43130) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x4312c) = 0x6a4;
  *(undefined4 *)(in_RDI + 0x43120) = 2000;
  *(undefined4 *)(in_RDI + 0x43134) = 0xabe;
  *(undefined4 *)(in_RDI + 0x43138) = 0x640;
  *(undefined4 *)(in_RDI + 0x43144) = 2000;
  *(undefined4 *)(in_RDI + 0x43140) = 2000;
  *(undefined4 *)(in_RDI + 0x4314c) = 0xa50;
  *(undefined4 *)(in_RDI + 0x43148) = 0x898;
  *(undefined4 *)(in_RDI + 0x4313c) = 0x960;
  *(undefined4 *)(in_RDI + 0x43150) = 0xc80;
  *(undefined4 *)(in_RDI + 0x43154) = 0x640;
  *(undefined4 *)(in_RDI + 0x43160) = 2000;
  *(undefined4 *)(in_RDI + 0x4315c) = 0x708;
  *(undefined4 *)(in_RDI + 0x43168) = 0x898;
  *(undefined4 *)(in_RDI + 0x43164) = 0x898;
  *(undefined4 *)(in_RDI + 0x43158) = 0x960;
  *(undefined4 *)(in_RDI + 0x4316c) = 0xc80;
  *(undefined4 *)(in_RDI + 0x43170) = 0x6e0;
  *(undefined4 *)(in_RDI + 0x4317c) = 0x960;
  *(undefined4 *)(in_RDI + 0x43178) = 2000;
  *(undefined4 *)(in_RDI + 0x43184) = 0x6e0;
  *(undefined4 *)(in_RDI + 0x43180) = 0xa50;
  *(undefined4 *)(in_RDI + 0x43174) = 0x960;
  *(undefined4 *)(in_RDI + 0x43188) = 0xc80;
  *(undefined4 *)(in_RDI + 0x4318c) = 0x640;
  *(undefined4 *)(in_RDI + 0x43198) = 2000;
  *(undefined4 *)(in_RDI + 0x43194) = 2000;
  *(undefined4 *)(in_RDI + 0x431a0) = 0x898;
  *(undefined4 *)(in_RDI + 0x4319c) = 0x7bc;
  *(undefined4 *)(in_RDI + 0x43190) = 0xa50;
  *(undefined4 *)(in_RDI + 0x431a4) = 0xc80;
  *(undefined4 *)(in_RDI + 0x431a8) = 1000;
  *(undefined4 *)(in_RDI + 0x431ac) = 1000;
  *(undefined4 *)(in_RDI + 0x431b0) = 0x898;
  *(undefined4 *)(in_RDI + 0x431b4) = 2000;
  *(undefined4 *)(in_RDI + 0x431b8) = 2000;
  *(undefined4 *)(in_RDI + 0x431bc) = 2000;
  *(undefined4 *)(in_RDI + 0x431c0) = 0x708;
  *(undefined4 *)(in_RDI + 0x431c4) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x431c8) = 2000;
  *(undefined4 *)(in_RDI + 0x431cc) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x431d0) = 2000;
  *(undefined4 *)(in_RDI + 0x431d4) = 0x9c4;
  *(undefined4 *)(in_RDI + 0x431d8) = 0x9c4;
  return;
}

Assistant:

void av1_set_rd_speed_thresholds(AV1_COMP *cpi) {
  RD_OPT *const rd = &cpi->rd;

  // Set baseline threshold values.
  av1_zero(rd->thresh_mult);

  rd->thresh_mult[THR_NEARESTMV] = 300;
  rd->thresh_mult[THR_NEARESTL2] = 300;
  rd->thresh_mult[THR_NEARESTL3] = 300;
  rd->thresh_mult[THR_NEARESTB] = 300;
  rd->thresh_mult[THR_NEARESTA2] = 300;
  rd->thresh_mult[THR_NEARESTA] = 300;
  rd->thresh_mult[THR_NEARESTG] = 300;

  rd->thresh_mult[THR_NEWMV] = 1000;
  rd->thresh_mult[THR_NEWL2] = 1000;
  rd->thresh_mult[THR_NEWL3] = 1000;
  rd->thresh_mult[THR_NEWB] = 1000;
  rd->thresh_mult[THR_NEWA2] = 1100;
  rd->thresh_mult[THR_NEWA] = 1000;
  rd->thresh_mult[THR_NEWG] = 1000;

  rd->thresh_mult[THR_NEARMV] = 1000;
  rd->thresh_mult[THR_NEARL2] = 1000;
  rd->thresh_mult[THR_NEARL3] = 1000;
  rd->thresh_mult[THR_NEARB] = 1000;
  rd->thresh_mult[THR_NEARA2] = 1000;
  rd->thresh_mult[THR_NEARA] = 1000;
  rd->thresh_mult[THR_NEARG] = 1000;

  rd->thresh_mult[THR_GLOBALMV] = 2200;
  rd->thresh_mult[THR_GLOBALL2] = 2000;
  rd->thresh_mult[THR_GLOBALL3] = 2000;
  rd->thresh_mult[THR_GLOBALB] = 2400;
  rd->thresh_mult[THR_GLOBALA2] = 2000;
  rd->thresh_mult[THR_GLOBALG] = 2000;
  rd->thresh_mult[THR_GLOBALA] = 2400;

  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLA] = 1100;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL2A] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL3A] = 800;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTGA] = 900;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLB] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL2B] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL3B] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTGB] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLA2] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL2A2] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTL3A2] = 1000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTGA2] = 1000;

  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLL2] = 2000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLL3] = 2000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTLG] = 2000;
  rd->thresh_mult[THR_COMP_NEAREST_NEARESTBA] = 2000;

  rd->thresh_mult[THR_COMP_NEAR_NEARLA] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLA] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLA] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWLA] = 1530;
  rd->thresh_mult[THR_COMP_NEW_NEARLA] = 1870;
  rd->thresh_mult[THR_COMP_NEW_NEWLA] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLA] = 2750;

  rd->thresh_mult[THR_COMP_NEAR_NEARL2A] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL2A] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL2A] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL2A] = 1870;
  rd->thresh_mult[THR_COMP_NEW_NEARL2A] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL2A] = 1800;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL2A] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL3A] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL3A] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL3A] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL3A] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL3A] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL3A] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL3A] = 3000;

  rd->thresh_mult[THR_COMP_NEAR_NEARGA] = 1320;
  rd->thresh_mult[THR_COMP_NEAREST_NEWGA] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTGA] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWGA] = 2040;
  rd->thresh_mult[THR_COMP_NEW_NEARGA] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWGA] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALGA] = 2250;

  rd->thresh_mult[THR_COMP_NEAR_NEARLB] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLB] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLB] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWLB] = 1360;
  rd->thresh_mult[THR_COMP_NEW_NEARLB] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWLB] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLB] = 2250;

  rd->thresh_mult[THR_COMP_NEAR_NEARL2B] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL2B] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL2B] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL2B] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL2B] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL2B] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL2B] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL3B] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL3B] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL3B] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL3B] = 1870;
  rd->thresh_mult[THR_COMP_NEW_NEARL3B] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL3B] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL3B] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARGB] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWGB] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTGB] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWGB] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARGB] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWGB] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALGB] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARLA2] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLA2] = 1800;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLA2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWLA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARLA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWLA2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLA2] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL2A2] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL2A2] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL2A2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL2A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL2A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL2A2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL2A2] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARL3A2] = 1440;
  rd->thresh_mult[THR_COMP_NEAREST_NEWL3A2] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTL3A2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWL3A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARL3A2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWL3A2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALL3A2] = 2500;

  rd->thresh_mult[THR_COMP_NEAR_NEARGA2] = 1200;
  rd->thresh_mult[THR_COMP_NEAREST_NEWGA2] = 1500;
  rd->thresh_mult[THR_COMP_NEW_NEARESTGA2] = 1500;
  rd->thresh_mult[THR_COMP_NEAR_NEWGA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEARGA2] = 1700;
  rd->thresh_mult[THR_COMP_NEW_NEWGA2] = 2000;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALGA2] = 2750;

  rd->thresh_mult[THR_COMP_NEAR_NEARLL2] = 1600;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLL2] = 2000;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLL2] = 2000;
  rd->thresh_mult[THR_COMP_NEAR_NEWLL2] = 2640;
  rd->thresh_mult[THR_COMP_NEW_NEARLL2] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEWLL2] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLL2] = 3200;

  rd->thresh_mult[THR_COMP_NEAR_NEARLL3] = 1600;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLL3] = 2000;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLL3] = 1800;
  rd->thresh_mult[THR_COMP_NEAR_NEWLL3] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEARLL3] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEWLL3] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLL3] = 3200;

  rd->thresh_mult[THR_COMP_NEAR_NEARLG] = 1760;
  rd->thresh_mult[THR_COMP_NEAREST_NEWLG] = 2400;
  rd->thresh_mult[THR_COMP_NEW_NEARESTLG] = 2000;
  rd->thresh_mult[THR_COMP_NEAR_NEWLG] = 1760;
  rd->thresh_mult[THR_COMP_NEW_NEARLG] = 2640;
  rd->thresh_mult[THR_COMP_NEW_NEWLG] = 2400;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALLG] = 3200;

  rd->thresh_mult[THR_COMP_NEAR_NEARBA] = 1600;
  rd->thresh_mult[THR_COMP_NEAREST_NEWBA] = 2000;
  rd->thresh_mult[THR_COMP_NEW_NEARESTBA] = 2000;
  rd->thresh_mult[THR_COMP_NEAR_NEWBA] = 2200;
  rd->thresh_mult[THR_COMP_NEW_NEARBA] = 1980;
  rd->thresh_mult[THR_COMP_NEW_NEWBA] = 2640;
  rd->thresh_mult[THR_COMP_GLOBAL_GLOBALBA] = 3200;

  rd->thresh_mult[THR_DC] = 1000;
  rd->thresh_mult[THR_PAETH] = 1000;
  rd->thresh_mult[THR_SMOOTH] = 2200;
  rd->thresh_mult[THR_SMOOTH_V] = 2000;
  rd->thresh_mult[THR_SMOOTH_H] = 2000;
  rd->thresh_mult[THR_H_PRED] = 2000;
  rd->thresh_mult[THR_V_PRED] = 1800;
  rd->thresh_mult[THR_D135_PRED] = 2500;
  rd->thresh_mult[THR_D203_PRED] = 2000;
  rd->thresh_mult[THR_D157_PRED] = 2500;
  rd->thresh_mult[THR_D67_PRED] = 2000;
  rd->thresh_mult[THR_D113_PRED] = 2500;
  rd->thresh_mult[THR_D45_PRED] = 2500;
}